

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

bool __thiscall cmTarget::IsAppBundleOnApple(cmTarget *this)

{
  bool bVar1;
  char *val;
  string local_58;
  string local_38;
  
  if (this->TargetTypeValue == EXECUTABLE) {
    local_38.field_2._M_allocated_capacity._0_4_ = 0x4c505041;
    local_38.field_2._M_allocated_capacity._4_2_ = 0x45;
    local_38._M_string_length = 5;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    bVar1 = cmMakefile::IsOn(this->Makefile,&local_38);
    if (bVar1) {
      local_58.field_2._M_allocated_capacity._0_5_ = 0x534f43414d;
      local_58.field_2._M_allocated_capacity._5_3_ = 0x425f58;
      local_58.field_2._8_5_ = 0x454c444e55;
      local_58._M_string_length = 0xd;
      local_58.field_2._M_local_buf[0xd] = '\0';
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      val = GetProperty(this,&local_58,this->Makefile);
      bVar1 = cmSystemTools::IsOn(val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT35(local_58.field_2._M_allocated_capacity._5_3_,
                                 local_58.field_2._M_allocated_capacity._0_5_) + 1);
      }
    }
    else {
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,
                      CONCAT26(local_38.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_38.field_2._M_allocated_capacity._4_2_,
                                        local_38.field_2._M_allocated_capacity._0_4_)) + 1);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmTarget::IsAppBundleOnApple() const
{
  return (this->GetType() == cmTarget::EXECUTABLE &&
          this->Makefile->IsOn("APPLE") &&
          this->GetPropertyAsBool("MACOSX_BUNDLE"));
}